

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O1

int cmime_message_part_remove(CMimeMessage_T *message,CMimePart_T *part)

{
  CMimeList_T *list;
  int iVar1;
  CMimeList_T *elem;
  CMimePart_T *local_18;
  CMimePart_T *tf;
  
  local_18 = (CMimePart_T *)0x0;
  if (message == (CMimeMessage_T *)0x0) {
    __assert_fail("message",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x4c6,"int cmime_message_part_remove(CMimeMessage_T *, CMimePart_T *)");
  }
  if (part == (CMimePart_T *)0x0) {
    __assert_fail("part",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x4c7,"int cmime_message_part_remove(CMimeMessage_T *, CMimePart_T *)");
  }
  list = message->parts;
  elem = list;
  do {
    elem = (CMimeList_T *)elem->head;
    if (elem == (CMimeList_T *)0x0) {
      iVar1 = 0;
      goto LAB_00109040;
    }
  } while (*(CMimePart_T **)elem != part);
  if (part->last == 1) {
    *(undefined2 *)(*(long *)elem->destroy + 0x28) = 1;
  }
  iVar1 = cmime_list_remove(list,(CMimeListElem_T *)elem,&local_18);
LAB_00109040:
  cmime_part_free(local_18);
  return iVar1;
}

Assistant:

int cmime_message_part_remove(CMimeMessage_T *message, CMimePart_T *part) {
    int ret = 0;
    CMimeListElem_T *elem = NULL;
    CMimePart_T *p = NULL;
    CMimePart_T *tf = NULL;
    CMimePart_T *prev = NULL;

    assert(message);
    assert(part);

    elem = cmime_list_head(message->parts);
    while(elem != NULL) {
        p = (CMimePart_T *)cmime_list_data(elem);
        if (p == part) {
            if (part->last == 1) {
                prev = (CMimePart_T *)cmime_list_data(elem->prev);
                prev->last = 1;
            }
            ret = cmime_list_remove(message->parts,elem,(void *)&tf);
            break;
        }
        elem = elem->next;
    }

    cmime_part_free(tf);

    return(ret);
}